

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v7::print<char[38],int,unsigned_int&,char>
               (FILE *f,char (*format_str) [38],int *args,uint *args_1)

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_int,_unsigned_int>
  *vargs;
  FILE *in_stack_000001c0;
  undefined1 in_stack_000001c8 [16];
  undefined1 in_stack_000001d8 [16];
  remove_reference_t<unsigned_int_&> *in_stack_ffffffffffffff58;
  remove_reference_t<int> *in_stack_ffffffffffffff60;
  char (*in_stack_ffffffffffffff68) [38];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> local_78 [2];
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_50;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_28;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_20;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_18;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_10;
  value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *local_8;
  
  make_args_checked<int,unsigned_int&,char[38],char>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  local_50 = local_78;
  to_string_view<char,_0>((char *)0x113262);
  local_20 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&stack0xffffffffffffff68;
  local_28 = local_50;
  local_18 = local_50;
  local_8 = local_50;
  local_10 = local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_20,0x21,local_50);
  vprint(in_stack_000001c0,(string_view)in_stack_000001d8,(format_args)in_stack_000001c8);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}